

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O3

QString * qulltoBasicLatin(QString *__return_storage_ptr__,qulonglong number,int base,bool negative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  short sVar3;
  QChar *pQVar4;
  QChar *unicode;
  ulong uVar5;
  char16_t cVar6;
  long in_FS_OFFSET;
  bool bVar7;
  char16_t buff [65];
  char16_t local_1a [2];
  undefined1 local_16 [6];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (number == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"0";
    (__return_storage_ptr__->d).size = 1;
  }
  else {
    uVar5 = (ulong)base;
    pQVar4 = (QChar *)(local_1a + 1);
    do {
      unicode = pQVar4;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = number;
      sVar3 = SUB162(auVar2 % auVar1,0);
      cVar6 = sVar3 + L'0';
      if (9 < SUB164(auVar2 % auVar1,0)) {
        cVar6 = sVar3 + L'W';
      }
      unicode->ucs = cVar6;
      pQVar4 = unicode + -1;
      bVar7 = uVar5 <= number;
      number = number / uVar5;
    } while (bVar7);
    if (negative) {
      pQVar4->ucs = L'-';
      unicode = pQVar4;
    }
    QString::QString(__return_storage_ptr__,unicode,(long)(local_16 + -(long)unicode) >> 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString qulltoBasicLatin(qulonglong number, int base, bool negative)
{
    if (number == 0)
        return QStringLiteral("0");
    // Length of MIN_LLONG with the sign in front is 65; we never need surrogate pairs.
    // We do not need a terminator.
    const unsigned maxlen = 65;
    static_assert(CHAR_BIT * sizeof(number) + 1 <= maxlen);
    Q_DECL_UNINITIALIZED char16_t buff[maxlen];
    char16_t *const end = buff + maxlen, *p = end;

    qulltoString_helper<char16_t>(number, base, p);
    if (negative)
        *--p = u'-';

    return QString(reinterpret_cast<QChar *>(p), end - p);
}